

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::addSamplerString(CLIntercept *this,cl_sampler sampler,string *str)

{
  mapped_type *this_00;
  string *in_RDX;
  long in_RSI;
  key_type *in_RDI;
  map<_cl_sampler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<_cl_sampler_*>,_std::allocator<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *unaff_retaddr;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffc0;
  
  if (in_RSI != 0) {
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    this_00 = std::
              map<_cl_sampler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<_cl_sampler_*>,_std::allocator<std::pair<_cl_sampler_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](unaff_retaddr,in_RDI);
    std::__cxx11::string::operator=((string *)this_00,in_RDX);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20a838);
  }
  return;
}

Assistant:

void CLIntercept::addSamplerString(
    cl_sampler sampler,
    const std::string& str )
{
    if( sampler )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        m_SamplerDataMap[sampler] = str;
    }
}